

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O0

int mbedtls_asn1_write_tagged_string(uchar **p,uchar *start,int tag,char *text,size_t text_len)

{
  uchar **in_RCX;
  uchar *in_R8;
  size_t len;
  int ret;
  size_t in_stack_ffffffffffffffb8;
  long lVar1;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  lVar1 = 0;
  local_4 = mbedtls_asn1_write_raw_buffer
                      (in_RCX,in_R8,(uchar *)CONCAT44(0xffffff92,in_stack_ffffffffffffffc8),0);
  if (-1 < local_4) {
    local_4 = mbedtls_asn1_write_len_and_tag
                        ((uchar **)CONCAT44(local_4,in_stack_ffffffffffffffc8),
                         (uchar *)(local_4 + lVar1),in_stack_ffffffffffffffb8,'\0');
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_write_tagged_string(unsigned char **p, const unsigned char *start, int tag,
                                     const char *text, size_t text_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start,
                                                            (const unsigned char *) text,
                                                            text_len));

    return mbedtls_asn1_write_len_and_tag(p, start, len, tag);
}